

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sg_scan_sse41_128_64.c
# Opt level: O0

parasail_result_t *
parasail_sg_flags_rowcol_scan_profile_sse41_128_64
          (parasail_profile_t *profile,char *s2,int s2Len,int open,int gap,int s1_beg,int s1_end,
          int s2_beg,int s2_end)

{
  int iVar1;
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  int iVar4;
  uint uVar5;
  int iVar6;
  int iVar7;
  __m128i *ptr;
  int64_t *ptr_00;
  __m128i *ptr_01;
  longlong *ptr_02;
  __m128i *ptr_03;
  uint uVar8;
  int iVar9;
  ulong extraout_RDX;
  int *col;
  longlong extraout_XMM0_Qa;
  longlong extraout_XMM0_Qa_00;
  longlong extraout_XMM0_Qa_01;
  ulong extraout_XMM0_Qa_02;
  longlong extraout_XMM0_Qa_03;
  ulong extraout_XMM0_Qa_04;
  ulong extraout_XMM0_Qa_05;
  longlong extraout_XMM0_Qb;
  longlong extraout_XMM0_Qb_00;
  undefined8 extraout_XMM0_Qb_01;
  ulong extraout_XMM0_Qb_02;
  longlong extraout_XMM0_Qb_03;
  ulong extraout_XMM0_Qb_04;
  ulong extraout_XMM0_Qb_05;
  __m128i a;
  __m128i a_00;
  __m128i a_01;
  __m128i a_02;
  __m128i a_03;
  __m128i a_04;
  __m128i a_05;
  __m128i a_06;
  __m128i a_07;
  __m128i a_08;
  __m128i a_09;
  __m128i a_10;
  __m128i a_11;
  __m128i a_12;
  __m128i a_13;
  __m128i a_14;
  __m128i alVar11;
  __m128i alVar12;
  __m128i b;
  __m128i b_00;
  __m128i b_01;
  __m128i b_02;
  __m128i b_03;
  __m128i b_04;
  __m128i b_05;
  __m128i b_06;
  __m128i b_07;
  __m128i b_08;
  __m128i b_09;
  __m128i b_10;
  __m128i b_11;
  __m128i b_12;
  __m128i vH_00;
  ulong local_6e8;
  int local_6dc;
  long local_6d8;
  long local_6d0;
  int local_6c4;
  longlong lStack_6b8;
  __m128i vH_2;
  int32_t temp;
  int32_t column_len;
  int64_t *t;
  __m128i vH_1;
  __m128i vCompare;
  __m128i vFt;
  __m128i vW;
  __m128i *pvW;
  __m128i vHp;
  __m128i vH;
  __m128i vF;
  __m128i vHt;
  __m128i vE;
  __m128i vGapper;
  int64_t tmp_1;
  int64_t tmp;
  __m128i_64_t e;
  __m128i_64_t h;
  int32_t segNum;
  int32_t index;
  parasail_result_t *result;
  __m128i vSegLenXgap;
  __m128i vNegInfFront;
  __m128i vPosMask;
  __m128i vMaxH;
  __m128i vSaturationCheckMax;
  __m128i vSaturationCheckMin;
  __m128i vPosLimit;
  __m128i vNegLimit;
  parasail_result_t *local_520;
  int64_t score;
  __m128i vZero;
  int64_t POS_LIMIT;
  int64_t NEG_LIMIT;
  __m128i vGapE;
  __m128i vGapO;
  __m128i *pvGapper;
  __m128i *pvH;
  __m128i *pvHt;
  int64_t *boundary;
  __m128i *pvE;
  __m128i *pvP;
  int32_t position;
  int32_t offset;
  int32_t segLen;
  int32_t segWidth;
  parasail_matrix_t *matrix;
  int32_t s1Len;
  int32_t end_ref;
  int32_t end_query;
  int32_t k;
  int32_t j;
  int32_t i;
  int s1_beg_local;
  int gap_local;
  int open_local;
  int s2Len_local;
  char *s2_local;
  parasail_profile_t *profile_local;
  longlong lVar10;
  ulong extraout_RDX_00;
  
  _segNum = (parasail_profile_t *)0x0;
  if (profile == (parasail_profile_t *)0x0) {
    fprintf(_stderr,"%s: missing %s\n","parasail_sg_flags_rowcol_scan_profile_sse41_128_64",
            "profile");
    profile_local = (parasail_profile_t *)0x0;
  }
  else if ((profile->profile64).score == (void *)0x0) {
    fprintf(_stderr,"%s: missing %s\n","parasail_sg_flags_rowcol_scan_profile_sse41_128_64",
            "profile->profile64.score");
    profile_local = (parasail_profile_t *)0x0;
  }
  else if (profile->matrix == (parasail_matrix_t *)0x0) {
    fprintf(_stderr,"%s: missing %s\n","parasail_sg_flags_rowcol_scan_profile_sse41_128_64",
            "profile->matrix");
    profile_local = (parasail_profile_t *)0x0;
  }
  else if (profile->s1Len < 1) {
    fprintf(_stderr,"%s: %s must be > 0\n","parasail_sg_flags_rowcol_scan_profile_sse41_128_64",
            "profile->s1Len");
    profile_local = (parasail_profile_t *)0x0;
  }
  else if (s2 == (char *)0x0) {
    fprintf(_stderr,"%s: missing %s\n","parasail_sg_flags_rowcol_scan_profile_sse41_128_64","s2");
    profile_local = (parasail_profile_t *)0x0;
  }
  else if (s2Len < 1) {
    fprintf(_stderr,"%s: %s must be > 0\n","parasail_sg_flags_rowcol_scan_profile_sse41_128_64",
            "s2Len");
    profile_local = (parasail_profile_t *)0x0;
  }
  else if (open < 0) {
    fprintf(_stderr,"%s: %s must be >= 0\n","parasail_sg_flags_rowcol_scan_profile_sse41_128_64",
            "open");
    profile_local = (parasail_profile_t *)0x0;
  }
  else if (gap < 0) {
    fprintf(_stderr,"%s: %s must be >= 0\n","parasail_sg_flags_rowcol_scan_profile_sse41_128_64",
            "gap");
    profile_local = (parasail_profile_t *)0x0;
  }
  else {
    iVar1 = profile->s1Len;
    matrix._4_4_ = s2Len - 1;
    iVar4 = (iVar1 + 1) / 2;
    iVar9 = (iVar1 + -1) % iVar4;
    uVar5 = ~((iVar1 + -1) / iVar4);
    iVar6 = uVar5 + 2;
    if (-open < profile->matrix->min) {
      alVar11[1] = (long)open;
    }
    else {
      alVar11[1] = -(long)profile->matrix->min;
    }
    local_520 = (parasail_result_t *)(alVar11[1] + -0x7fffffffffffffff);
    vSegLenXgap[0] = (longlong)(-iVar4 * gap);
    iVar7 = gap;
    result = local_520;
    vSegLenXgap[1] = (longlong)local_520;
    _segNum = (parasail_profile_t *)parasail_result_new_rowcol1(iVar4 * 2,s2Len);
    if (_segNum == (parasail_profile_t *)0x0) {
      profile_local = (parasail_profile_t *)0x0;
    }
    else {
      *(uint *)&_segNum->field_0xc = *(uint *)&_segNum->field_0xc | 0x2800402;
      uVar8 = 0;
      if (s1_beg != 0) {
        uVar8 = 8;
      }
      *(uint *)&_segNum->field_0xc = uVar8 | *(uint *)&_segNum->field_0xc;
      uVar8 = 0;
      if (s1_end != 0) {
        uVar8 = 0x10;
      }
      *(uint *)&_segNum->field_0xc = uVar8 | *(uint *)&_segNum->field_0xc;
      uVar8 = 0;
      if (s2_beg != 0) {
        uVar8 = 0x4000;
      }
      *(uint *)&_segNum->field_0xc = uVar8 | *(uint *)&_segNum->field_0xc;
      uVar8 = 0;
      if (s2_end != 0) {
        uVar8 = 0x8000;
      }
      *(uint *)&_segNum->field_0xc = uVar8 | *(uint *)&_segNum->field_0xc;
      uVar8 = *(uint *)&_segNum->field_0xc | 0x40000;
      alVar12[1] = (ulong)uVar8;
      *(uint *)&_segNum->field_0xc = uVar8;
      ptr = parasail_memalign___m128i(0x10,(long)iVar4);
      ptr_00 = parasail_memalign_int64_t(0x10,(long)(s2Len + 1));
      ptr_01 = parasail_memalign___m128i(0x10,(long)iVar4);
      ptr_02 = *parasail_memalign___m128i(0x10,(long)iVar4);
      vH_00[0] = (size_t)iVar4;
      col = (int *)0x10;
      ptr_03 = parasail_memalign___m128i(0x10,vH_00[0]);
      if (ptr == (__m128i *)0x0) {
        profile_local = (parasail_profile_t *)0x0;
      }
      else if (ptr_00 == (int64_t *)0x0) {
        profile_local = (parasail_profile_t *)0x0;
      }
      else if (ptr_01 == (__m128i *)0x0) {
        profile_local = (parasail_profile_t *)0x0;
      }
      else if ((__m128i *)ptr_02 == (__m128i *)0x0) {
        profile_local = (parasail_profile_t *)0x0;
      }
      else if (ptr_03 == (__m128i *)0x0) {
        profile_local = (parasail_profile_t *)0x0;
      }
      else {
        h.m[1]._4_4_ = 0;
        local_6e8 = extraout_RDX;
        for (k = 0; k < iVar4; k = k + 1) {
          for (h.m[1]._0_4_ = 0; (int)h.m[1]._0_4_ < 2; h.m[1]._0_4_ = h.m[1]._0_4_ + 1) {
            if (s1_beg == 0) {
              uVar8 = h.m[1]._0_4_ * iVar4 + k;
              local_6e8 = (ulong)uVar8;
              local_6c4 = -(gap * uVar8) - open;
            }
            else {
              local_6c4 = 0;
            }
            local_6d8 = (long)local_6c4;
            local_6d0 = local_6d8;
            if (local_6d8 < -0x8000000000000000) {
              local_6d0 = -0x8000000000000000;
            }
            *(long *)((long)&e + (long)(int)h.m[1]._0_4_ * 8 + 8) = local_6d0;
            local_6d8 = local_6d8 - open;
            if (local_6d8 < -0x8000000000000000) {
              local_6d8 = -0x8000000000000000;
            }
            (&tmp)[(int)h.m[1]._0_4_] = local_6d8;
          }
          ptr_02[(long)(int)h.m[1]._4_4_ * 2] = e.m[1];
          (ptr_02 + (long)(int)h.m[1]._4_4_ * 2)[1] = h.m[0];
          alVar12[1] = (long)(int)h.m[1]._4_4_ * 0x10;
          ptr[(int)h.m[1]._4_4_][0] = tmp;
          ptr[(int)h.m[1]._4_4_][1] = e.m[0];
          h.m[1]._4_4_ = h.m[1]._4_4_ + 1;
        }
        *ptr_00 = 0;
        for (k = 1; k <= s2Len; k = k + 1) {
          if (s2_beg == 0) {
            local_6dc = -(gap * (k + -1)) - open;
          }
          else {
            local_6dc = 0;
          }
          local_6e8 = (ulong)local_6dc;
          if ((long)local_6e8 < -0x8000000000000000) {
            local_6e8 = 0x8000000000000000;
          }
          alVar12[1] = (ulong)k;
          ptr_00[alVar12[1]] = local_6e8;
        }
        vE[1] = -(long)open;
        vGapper[0] = -(long)open;
        k = iVar4;
        while (k = k + -1, -1 < k) {
          alVar12[1] = (long)k * 0x10;
          ptr_03[k][0] = vE[1];
          ptr_03[k][1] = vGapper[0];
          vE[1] = vE[1] - gap;
          vGapper[0] = vGapper[0] - gap;
          a[1] = vH_00[0];
          a[0] = (longlong)col;
          alVar12[0] = local_6e8;
          alVar11 = _mm_min_epi64_rpl(a,alVar12);
          local_6e8 = alVar11[1];
        }
        vPosMask[1] = (longlong)local_520;
        vMaxH[0] = (longlong)local_520;
        for (end_query = 0; end_query < s2Len; end_query = end_query + 1) {
          vH_00[0] = (size_t)end_query;
          alVar12[1] = (ulong)(byte)s2[vH_00[0]];
          for (k = 0; k < iVar4; k = k + 1) {
            b[1] = (long)k * 0x10;
            a_00[1] = vH_00[0];
            a_00[0] = (longlong)col;
            b[0] = alVar12[1];
            alVar11 = _mm_max_epi64_rpl(a_00,b);
            alVar11[0] = alVar11[1];
            alVar11[1] = (long)k * 0x10;
            a_01[1] = vH_00[0];
            a_01[0] = (longlong)col;
            alVar12 = _mm_max_epi64_rpl(a_01,alVar11);
            b_00[0] = alVar12[1];
            a_02[1] = vH_00[0];
            a_02[0] = (longlong)col;
            b_00[1] = alVar11[1];
            alVar11 = _mm_max_epi64_rpl(a_02,b_00);
            alVar12[1] = alVar11[1];
            ptr[k][0] = extraout_XMM0_Qa;
            ptr[k][1] = extraout_XMM0_Qb;
            ptr_01[k][0] = extraout_XMM0_Qa_00;
            ptr_01[k][1] = extraout_XMM0_Qb_00;
          }
          b_01[1] = (long)end_query;
          a_03[1] = vH_00[0];
          a_03[0] = (longlong)col;
          b_01[0] = alVar12[1];
          alVar11 = _mm_max_epi64_rpl(a_03,b_01);
          alVar12[1] = alVar11[1];
          for (k = 0; k < 0; k = k + 1) {
            a_04[1] = vH_00[0];
            a_04[0] = (longlong)col;
            b_02[1] = 0;
            b_02[0] = alVar12[1];
            alVar11 = _mm_max_epi64_rpl(a_04,b_02);
            alVar12[1] = alVar11[1];
          }
          a_05[1] = vH_00[0];
          a_05[0] = (longlong)col;
          b_03[1] = 0;
          b_03[0] = alVar12[1];
          alVar11 = _mm_max_epi64_rpl(a_05,b_03);
          lVar10 = alVar11[1];
          for (k = 0; k < iVar4; k = k + 1) {
            b_04[1] = (long)k * 0x10;
            a_06[1] = vH_00[0];
            a_06[0] = (longlong)col;
            b_04[0] = lVar10;
            alVar11 = _mm_max_epi64_rpl(a_06,b_04);
            b_05[0] = alVar11[1];
            a_07[1] = vH_00[0];
            a_07[0] = (longlong)col;
            b_05[1] = b_04[1];
            alVar11 = _mm_max_epi64_rpl(a_07,b_05);
            b_06[0] = alVar11[1];
            b_06[1] = (long)k * 0x10;
            ptr_02[(long)k * 2] = extraout_XMM0_Qa_01;
            (ptr_02 + (long)k * 2)[1] = extraout_XMM0_Qb_01;
            a_08[1] = vH_00[0];
            a_08[0] = (longlong)col;
            alVar11 = _mm_min_epi64_rpl(a_08,b_06);
            b_07[0] = alVar11[1];
            a_09[1] = vH_00[0];
            a_09[0] = (longlong)col;
            b_07[1] = b_06[1];
            alVar11 = _mm_min_epi64_rpl(a_09,b_07);
            b_08[0] = alVar11[1];
            a_10[1] = vH_00[0];
            a_10[0] = (longlong)col;
            b_08[1] = b_06[1];
            alVar11 = _mm_max_epi64_rpl(a_10,b_08);
            lVar10 = alVar11[1];
          }
          b_09[1] = (long)iVar9 * 0x10;
          vHp[1] = ptr_02[(long)iVar9 * 2];
          vH[0] = (ptr_02 + (long)iVar9 * 2)[1];
          a_11[1] = vH_00[0];
          a_11[0] = (longlong)col;
          b_09[0] = lVar10;
          alVar11 = _mm_cmpgt_epi64_rpl(a_11,b_09);
          b_10[0] = alVar11[1];
          alVar12[1] = -(ulong)(uVar5 == 0xfffffffe) & extraout_XMM0_Qb_02;
          a_12[1] = vH_00[0];
          a_12[0] = (longlong)col;
          b_10[1] = b_09[1];
          _mm_max_epi64_rpl(a_12,b_10);
          auVar3._8_8_ = alVar12[1];
          auVar3._0_8_ = -(ulong)(iVar6 == 1) & extraout_XMM0_Qa_02;
          if ((((((((((((((((auVar3 >> 7 & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
                           (auVar3 >> 0xf & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                          (auVar3 >> 0x17 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                         (auVar3 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                        (auVar3 >> 0x27 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                       (auVar3 >> 0x2f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                      (auVar3 >> 0x37 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                     (auVar3 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                    (alVar12[1] >> 7 & 1) != 0) || (alVar12[1] >> 0xf & 1) != 0) ||
                  (alVar12[1] >> 0x17 & 1) != 0) || (alVar12[1] >> 0x1f & 1) != 0) ||
                (alVar12[1] >> 0x27 & 1) != 0) || (alVar12[1] >> 0x2f & 1) != 0) ||
              (alVar12[1] >> 0x37 & 1) != 0) || (long)alVar12[1] < 0) {
            matrix._4_4_ = end_query;
          }
          for (end_ref = 0; lVar10 = vHp[1], end_ref < iVar6; end_ref = end_ref + 1) {
            vHp[1] = 0;
            vH[0] = lVar10;
          }
          local_6e8 = vH[0] & 0xffffffff;
          alVar12[1] = (ulong)end_query;
          ((anon_union_8_5_1bed06c4_for_parasail_result_4 *)&_segNum->matrix)->rowcols->score_row
          [alVar12[1]] = (int)vH[0];
          vPosMask[1] = extraout_XMM0_Qa_03;
          vMaxH[0] = extraout_XMM0_Qb_03;
        }
        for (k = 0; k < iVar4; k = k + 1) {
          alVar12[1] = (long)k * 0x10;
          col = ((anon_union_8_5_1bed06c4_for_parasail_result_4 *)&_segNum->matrix)->rowcols->
                score_col;
          vH_00[0] = (size_t)(uint)k;
          vH_00[1]._0_4_ = iVar4;
          vH_00[1]._4_4_ = 0;
          arr_store_col(col,vH_00,(int32_t)alVar12[1],iVar7);
          local_6e8 = extraout_RDX_00;
        }
        if (s2_end != 0) {
          for (end_ref = 0; end_ref < iVar6; end_ref = end_ref + 1) {
            vMaxH[0] = vPosMask[1];
            vPosMask[1] = 0;
          }
          local_520 = (parasail_result_t *)vMaxH[0];
        }
        s1Len = iVar1 + -1;
        if (s1_end != 0) {
          _temp = ptr_02;
          for (k = 0; k < iVar4 * 2; k = k + 1) {
            uVar5 = (k % 2) * iVar4;
            local_6e8 = (ulong)uVar5;
            iVar7 = k / 2 + uVar5;
            if (iVar7 < iVar1) {
              if ((long)local_520 < *_temp) {
                local_520 = (parasail_result_t *)*_temp;
                matrix._4_4_ = s2Len - 1;
                s1Len = iVar7;
              }
              else if ((((parasail_result_t *)*_temp == local_520) &&
                       (alVar12[1] = (ulong)(s2Len - 1U), matrix._4_4_ == s2Len - 1U)) &&
                      (iVar7 < s1Len)) {
                s1Len = iVar7;
              }
            }
            _temp = _temp + 1;
          }
        }
        if ((s1_end == 0) && (s2_end == 0)) {
          alVar12[1] = (long)iVar9 * 0x10;
          lStack_6b8 = ptr_02[(long)iVar9 * 2];
          vH_2[0] = (ptr_02 + (long)iVar9 * 2)[1];
          for (end_ref = 0; lVar10 = lStack_6b8, end_ref < iVar6; end_ref = end_ref + 1) {
            lStack_6b8 = 0;
            vH_2[0] = lVar10;
          }
          local_520._0_4_ = (int)vH_2[0];
          matrix._4_4_ = s2Len - 1;
          s1Len = iVar1 + -1;
        }
        a_13[1] = vH_00[0];
        a_13[0] = (longlong)col;
        b_11[1] = alVar12[1];
        b_11[0] = local_6e8;
        alVar11 = _mm_cmplt_epi64_rpl(a_13,b_11);
        b_12[0] = alVar11[1];
        a_14[1] = vH_00[0];
        a_14[0] = (longlong)col;
        b_12[1] = alVar12[1];
        _mm_cmpgt_epi64_rpl(a_14,b_12);
        alVar12[1] = extraout_XMM0_Qb_04 | extraout_XMM0_Qb_05;
        auVar2._8_8_ = alVar12[1];
        auVar2._0_8_ = extraout_XMM0_Qa_04 | extraout_XMM0_Qa_05;
        if ((((((((((((((((auVar2 >> 7 & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
                         (auVar2 >> 0xf & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                        (auVar2 >> 0x17 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                       (auVar2 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                      (auVar2 >> 0x27 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                     (auVar2 >> 0x2f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                    (auVar2 >> 0x37 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                   (auVar2 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                  (alVar12[1] >> 7 & 1) != 0) || (alVar12[1] >> 0xf & 1) != 0) ||
                (alVar12[1] >> 0x17 & 1) != 0) || (alVar12[1] >> 0x1f & 1) != 0) ||
              (alVar12[1] >> 0x27 & 1) != 0) || (alVar12[1] >> 0x2f & 1) != 0) ||
            (alVar12[1] >> 0x37 & 1) != 0) || (long)alVar12[1] < 0) {
          *(uint *)&_segNum->field_0xc = *(uint *)&_segNum->field_0xc | 0x40;
          local_520._0_4_ = 0;
          s1Len = 0;
          matrix._4_4_ = 0;
        }
        *(int *)&_segNum->s1 = (int)local_520;
        *(int32_t *)((long)&_segNum->s1 + 4) = s1Len;
        _segNum->s1Len = matrix._4_4_;
        parasail_free(ptr_03);
        parasail_free(ptr_02);
        parasail_free(ptr_01);
        parasail_free(ptr_00);
        parasail_free(ptr);
        profile_local = _segNum;
      }
    }
  }
  return (parasail_result_t *)profile_local;
}

Assistant:

parasail_result_t* PNAME(
        const parasail_profile_t * const restrict profile,
        const char * const restrict s2, const int s2Len,
        const int open, const int gap,
        int s1_beg, int s1_end, int s2_beg, int s2_end)
{
    /* declare local variables */
    int32_t i = 0;
    int32_t j = 0;
    int32_t k = 0;
    int32_t end_query = 0;
    int32_t end_ref = 0;
    int32_t s1Len = 0;
    const parasail_matrix_t *matrix = NULL;
    int32_t segWidth = 0;
    int32_t segLen = 0;
    int32_t offset = 0;
    int32_t position = 0;
    __m128i* restrict pvP = NULL;
    __m128i* restrict pvE = NULL;
    int64_t* restrict boundary = NULL;
    __m128i* restrict pvHt = NULL;
    __m128i* restrict pvH = NULL;
    __m128i* restrict pvGapper = NULL;
    __m128i vGapO;
    __m128i vGapE;
    int64_t NEG_LIMIT = 0;
    int64_t POS_LIMIT = 0;
    __m128i vZero;
    int64_t score = 0;
    __m128i vNegLimit;
    __m128i vPosLimit;
    __m128i vSaturationCheckMin;
    __m128i vSaturationCheckMax;
    __m128i vMaxH;
    __m128i vPosMask;
    __m128i vNegInfFront;
    __m128i vSegLenXgap;
    parasail_result_t *result = NULL;

    /* validate inputs */
    PARASAIL_CHECK_NULL(profile);
    PARASAIL_CHECK_NULL(profile->profile64.score);
    PARASAIL_CHECK_NULL(profile->matrix);
    PARASAIL_CHECK_GT0(profile->s1Len);
    PARASAIL_CHECK_NULL(s2);
    PARASAIL_CHECK_GT0(s2Len);
    PARASAIL_CHECK_GE0(open);
    PARASAIL_CHECK_GE0(gap);

    /* initialize stack variables */
    i = 0;
    j = 0;
    k = 0;
    s1Len = profile->s1Len;
    end_query = s1Len-1;
    end_ref = s2Len-1;
    matrix = profile->matrix;
    segWidth = 2; /* number of values in vector unit */
    segLen = (s1Len + segWidth - 1) / segWidth;
    offset = (s1Len - 1) % segLen;
    position = (segWidth - 1) - (s1Len - 1) / segLen;
    pvP = (__m128i*)profile->profile64.score;
    vGapO = _mm_set1_epi64x_rpl(open);
    vGapE = _mm_set1_epi64x_rpl(gap);
    NEG_LIMIT = (-open < matrix->min ? INT64_MIN + open : INT64_MIN - matrix->min) + 1;
    POS_LIMIT = INT64_MAX - matrix->max - 1;
    vZero = _mm_setzero_si128();
    score = NEG_LIMIT;
    vNegLimit = _mm_set1_epi64x_rpl(NEG_LIMIT);
    vPosLimit = _mm_set1_epi64x_rpl(POS_LIMIT);
    vSaturationCheckMin = vPosLimit;
    vSaturationCheckMax = vNegLimit;
    vMaxH = vNegLimit;
    vPosMask = _mm_cmpeq_epi64(_mm_set1_epi64x_rpl(position),
            _mm_set_epi64x_rpl(0,1));
    vNegInfFront = vZero;
    vNegInfFront = _mm_insert_epi64_rpl(vNegInfFront, NEG_LIMIT, 0);
    vSegLenXgap = _mm_add_epi64(vNegInfFront,
            _mm_slli_si128(_mm_set1_epi64x_rpl(-segLen*gap), 8));

    /* initialize result */
#ifdef PARASAIL_TABLE
    result = parasail_result_new_table1(segLen*segWidth, s2Len);
#else
#ifdef PARASAIL_ROWCOL
    result = parasail_result_new_rowcol1(segLen*segWidth, s2Len);
#else
    result = parasail_result_new();
#endif
#endif
    if (!result) return NULL;

    /* set known flags */
    result->flag |= PARASAIL_FLAG_SG | PARASAIL_FLAG_SCAN
        | PARASAIL_FLAG_BITS_64 | PARASAIL_FLAG_LANES_2;
    result->flag |= s1_beg ? PARASAIL_FLAG_SG_S1_BEG : 0;
    result->flag |= s1_end ? PARASAIL_FLAG_SG_S1_END : 0;
    result->flag |= s2_beg ? PARASAIL_FLAG_SG_S2_BEG : 0;
    result->flag |= s2_end ? PARASAIL_FLAG_SG_S2_END : 0;
#ifdef PARASAIL_TABLE
    result->flag |= PARASAIL_FLAG_TABLE;
#endif
#ifdef PARASAIL_ROWCOL
    result->flag |= PARASAIL_FLAG_ROWCOL;
#endif

    /* initialize heap variables */
    pvE = parasail_memalign___m128i(16, segLen);
    boundary = parasail_memalign_int64_t(16, s2Len+1);
    pvHt= parasail_memalign___m128i(16, segLen);
    pvH = parasail_memalign___m128i(16, segLen);
    pvGapper = parasail_memalign___m128i(16, segLen);

    /* validate heap variables */
    if (!pvE) return NULL;
    if (!boundary) return NULL;
    if (!pvHt) return NULL;
    if (!pvH) return NULL;
    if (!pvGapper) return NULL;

    /* initialize H and E */
    {
        int32_t index = 0;
        for (i=0; i<segLen; ++i) {
            int32_t segNum = 0;
            __m128i_64_t h;
            __m128i_64_t e;
            for (segNum=0; segNum<segWidth; ++segNum) {
                int64_t tmp = s1_beg ? 0 : (-open-gap*(segNum*segLen+i));
                h.v[segNum] = tmp < INT64_MIN ? INT64_MIN : tmp;
                tmp = tmp - open;
                e.v[segNum] = tmp < INT64_MIN ? INT64_MIN : tmp;
            }
            _mm_store_si128(&pvH[index], h.m);
            _mm_store_si128(&pvE[index], e.m);
            ++index;
        }
    }

    /* initialize uppder boundary */
    {
        boundary[0] = 0;
        for (i=1; i<=s2Len; ++i) {
            int64_t tmp = s2_beg ? 0 : (-open-gap*(i-1));
            boundary[i] = tmp < INT64_MIN ? INT64_MIN : tmp;
        }
    }

    {
        __m128i vGapper = _mm_sub_epi64(vZero,vGapO);
        for (i=segLen-1; i>=0; --i) {
            _mm_store_si128(pvGapper+i, vGapper);
            vGapper = _mm_sub_epi64(vGapper, vGapE);
            /* long queries and/or large penalties will break the pseudo prefix scan */
            vSaturationCheckMin = _mm_min_epi64_rpl(vSaturationCheckMin, vGapper);
        }
    }

    /* outer loop over database sequence */
    for (j=0; j<s2Len; ++j) {
        __m128i vE;
        __m128i vHt;
        __m128i vF;
        __m128i vH;
        __m128i vHp;
        __m128i *pvW;
        __m128i vW;

        /* calculate E */
        /* calculate Ht */
        /* calculate F and H first pass */
        vHp = _mm_load_si128(pvH+(segLen-1));
        vHp = _mm_slli_si128(vHp, 8);
        vHp = _mm_insert_epi64_rpl(vHp, boundary[j], 0);
        pvW = pvP + matrix->mapper[(unsigned char)s2[j]]*segLen;
        vHt = _mm_sub_epi64(vNegLimit, pvGapper[0]);
        vF = vNegLimit;
        for (i=0; i<segLen; ++i) {
            vH = _mm_load_si128(pvH+i);
            vE = _mm_load_si128(pvE+i);
            vW = _mm_load_si128(pvW+i);
            vE = _mm_max_epi64_rpl(
                    _mm_sub_epi64(vE, vGapE),
                    _mm_sub_epi64(vH, vGapO));
            vHp = _mm_add_epi64(vHp, vW);
            vF = _mm_max_epi64_rpl(vF, _mm_add_epi64(vHt, pvGapper[i]));
            vHt = _mm_max_epi64_rpl(vE, vHp);
            _mm_store_si128(pvE+i, vE);
            _mm_store_si128(pvHt+i, vHt);
            vHp = vH;
        }

        /* pseudo prefix scan on F and H */
        vHt = _mm_slli_si128(vHt, 8);
        vHt = _mm_insert_epi64_rpl(vHt, boundary[j+1], 0);
        vF = _mm_max_epi64_rpl(vF, _mm_add_epi64(vHt, pvGapper[0]));
        for (i=0; i<segWidth-2; ++i) {
            __m128i vFt = _mm_slli_si128(vF, 8);
            vFt = _mm_add_epi64(vFt, vSegLenXgap);
            vF = _mm_max_epi64_rpl(vF, vFt);
        }

        /* calculate final H */
        vF = _mm_slli_si128(vF, 8);
        vF = _mm_add_epi64(vF, vNegInfFront);
        vH = _mm_max_epi64_rpl(vHt, vF);
        for (i=0; i<segLen; ++i) {
            vHt = _mm_load_si128(pvHt+i);
            vF = _mm_max_epi64_rpl(
                    _mm_sub_epi64(vF, vGapE),
                    _mm_sub_epi64(vH, vGapO));
            vH = _mm_max_epi64_rpl(vHt, vF);
            _mm_store_si128(pvH+i, vH);
            vSaturationCheckMin = _mm_min_epi64_rpl(vSaturationCheckMin, vH);
            vSaturationCheckMin = _mm_min_epi64_rpl(vSaturationCheckMin, vF);
            vSaturationCheckMax = _mm_max_epi64_rpl(vSaturationCheckMax, vH);
#ifdef PARASAIL_TABLE
            arr_store_si128(result->tables->score_table, vH, i, segLen, j, s2Len);
#endif
        } 

        /* extract vector containing last value from column */
        {
            __m128i vCompare;
            vH = _mm_load_si128(pvH + offset);
            vCompare = _mm_and_si128(vPosMask, _mm_cmpgt_epi64_rpl(vH, vMaxH));
            vMaxH = _mm_max_epi64_rpl(vH, vMaxH);
            if (_mm_movemask_epi8(vCompare)) {
                end_ref = j;
            }
#ifdef PARASAIL_ROWCOL
            for (k=0; k<position; ++k) {
                vH = _mm_slli_si128(vH, 8);
            }
            result->rowcols->score_row[j] = (int64_t) _mm_extract_epi64_rpl (vH, 1);
#endif
        }
    }

#ifdef PARASAIL_ROWCOL
    for (i=0; i<segLen; ++i) {
        __m128i vH = _mm_load_si128(pvH + i);
        arr_store_col(result->rowcols->score_col, vH, i, segLen);
    }
#endif

    /* max last value from all columns */
    if (s2_end)
    {
        for (k=0; k<position; ++k) {
            vMaxH = _mm_slli_si128(vMaxH, 8);
        }
        score = (int64_t) _mm_extract_epi64_rpl(vMaxH, 1);
        end_query = s1Len-1;
    }

    /* max of last column */
    if (s1_end)
    {
        /* Trace the alignment ending position on read. */
        int64_t *t = (int64_t*)pvH;
        int32_t column_len = segLen * segWidth;
        for (i = 0; i<column_len; ++i, ++t) {
            int32_t temp = i / segWidth + i % segWidth * segLen;
            if (temp >= s1Len) continue;
            if (*t > score) {
                score = *t;
                end_query = temp;
                end_ref = s2Len-1;
            }
            else if (*t == score && end_ref == s2Len-1 && temp < end_query) {
                end_query = temp;
            }
        }
    }

    if (!s1_end && !s2_end) {
        /* extract last value from the last column */
        {
            __m128i vH = _mm_load_si128(pvH + offset);
            for (k=0; k<position; ++k) {
                vH = _mm_slli_si128(vH, 8);
            }
            score = (int64_t) _mm_extract_epi64_rpl (vH, 1);
            end_ref = s2Len - 1;
            end_query = s1Len - 1;
        }
    }

    if (_mm_movemask_epi8(_mm_or_si128(
            _mm_cmplt_epi64_rpl(vSaturationCheckMin, vNegLimit),
            _mm_cmpgt_epi64_rpl(vSaturationCheckMax, vPosLimit)))) {
        result->flag |= PARASAIL_FLAG_SATURATED;
        score = 0;
        end_query = 0;
        end_ref = 0;
    }

    result->score = score;
    result->end_query = end_query;
    result->end_ref = end_ref;

    parasail_free(pvGapper);
    parasail_free(pvH);
    parasail_free(pvHt);
    parasail_free(boundary);
    parasail_free(pvE);

    return result;
}